

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbt_set.cpp
# Opt level: O3

void __thiscall
icu_63::TransliterationRuleSet::TransliterationRuleSet
          (TransliterationRuleSet *this,TransliterationRuleSet *other)

{
  UVector **ppUVar1;
  int iVar2;
  UErrorCode UVar3;
  UVector *pUVar4;
  TransliterationRule *this_00;
  TransliterationRule *other_00;
  int index;
  int32_t *__src;
  code *pcVar5;
  UErrorCode status;
  UParseError p;
  UErrorCode local_7c;
  undefined1 local_78 [72];
  
  this->_vptr_TransliterationRuleSet = (_func_int **)&PTR__TransliterationRuleSet_00471cb0;
  ppUVar1 = &this->ruleVector;
  this->ruleVector = (UVector *)0x0;
  this->rules = (TransliterationRule **)0x0;
  this->maxContextLength = other->maxContextLength;
  __src = other->index;
  memcpy(this->index,__src,0x404);
  local_7c = U_ZERO_ERROR;
  pUVar4 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)__src);
  if (pUVar4 == (UVector *)0x0) {
    *ppUVar1 = (UVector *)0x0;
    UVar3 = U_ZERO_ERROR;
  }
  else {
    pcVar5 = _deleteRule;
    UVector::UVector(pUVar4,_deleteRule,(UElementsAreEqual *)0x0,&local_7c);
    *ppUVar1 = pUVar4;
    pUVar4 = other->ruleVector;
    this_00 = (TransliterationRule *)
              CONCAT71((int7)((ulong)pcVar5 >> 8),
                       U_ZERO_ERROR < local_7c || pUVar4 == (UVector *)0x0);
    UVar3 = local_7c;
    if ((U_ZERO_ERROR >= local_7c && pUVar4 != (UVector *)0x0) && (iVar2 = pUVar4->count, 0 < iVar2)
       ) {
      index = 0;
      do {
        this_00 = (TransliterationRule *)UMemory::operator_new((UMemory *)0x88,(size_t)this_00);
        if (this_00 == (TransliterationRule *)0x0) {
          return;
        }
        other_00 = (TransliterationRule *)UVector::elementAt(other->ruleVector,index);
        TransliterationRule::TransliterationRule(this_00,other_00);
        UVector::addElement(*ppUVar1,this_00,&local_7c);
        if (U_ZERO_ERROR < local_7c) {
          return;
        }
        index = index + 1;
        UVar3 = local_7c;
      } while (index < iVar2);
    }
  }
  if (UVar3 < U_ILLEGAL_ARGUMENT_ERROR && other->rules != (TransliterationRule **)0x0) {
    (*this->_vptr_TransliterationRuleSet[4])(this,local_78,&local_7c);
  }
  return;
}

Assistant:

TransliterationRuleSet::TransliterationRuleSet(const TransliterationRuleSet& other) :
    UMemory(other),
    ruleVector(0),
    rules(0),
    maxContextLength(other.maxContextLength) {

    int32_t i, len;
    uprv_memcpy(index, other.index, sizeof(index));
    UErrorCode status = U_ZERO_ERROR;
    ruleVector = new UVector(&_deleteRule, NULL, status);
    if (other.ruleVector != 0 && ruleVector != 0 && U_SUCCESS(status)) {
        len = other.ruleVector->size();
        for (i=0; i<len && U_SUCCESS(status); ++i) {
            TransliterationRule *tempTranslitRule = new TransliterationRule(*(TransliterationRule*)other.ruleVector->elementAt(i));
            // Null pointer test
            if (tempTranslitRule == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                break;
            }
            ruleVector->addElement(tempTranslitRule, status);
            if (U_FAILURE(status)) {
                break;
            }
        }
    }
    if (other.rules != 0 && U_SUCCESS(status)) {
        UParseError p;
        freeze(p, status);
    }
}